

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

size_t __thiscall capnp::SchemaFile::DiskSchemaFile::hashCode(DiskSchemaFile *this)

{
  String *pSVar1;
  char *pcVar2;
  char c;
  char *__end3;
  char *__begin3;
  String *__range3;
  String *part;
  String *__end2;
  String *__begin2;
  Path *__range2;
  size_t result;
  DiskSchemaFile *this_local;
  
  __range2 = (Path *)this->baseDir;
  __end2 = kj::Path::begin(&this->path);
  pSVar1 = kj::Path::end(&this->path);
  for (; __end2 != pSVar1; __end2 = __end2 + 1) {
    __end3 = kj::String::begin(__end2);
    pcVar2 = kj::String::end(__end2);
    for (; __end3 != pcVar2; __end3 = __end3 + 1) {
      __range2 = (Path *)((long)__range2 * 0x21 ^ (long)*__end3);
    }
    __range2 = (Path *)((long)__range2 * 0x21 ^ 0x2f);
  }
  return (size_t)__range2;
}

Assistant:

size_t hashCode() const override {
    // djb hash with xor
    // TODO(someday):  Add hashing library to KJ.
    size_t result = reinterpret_cast<uintptr_t>(&baseDir);
    for (auto& part: path) {
      for (char c: part) {
        result = (result * 33) ^ c;
      }
      result = (result * 33) ^ '/';
    }
    return result;
  }